

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::
ParserValidationErrorTest_Proto2CustomJsonConflictError_Test::
ParserValidationErrorTest_Proto2CustomJsonConflictError_Test
          (ParserValidationErrorTest_Proto2CustomJsonConflictError_Test *this)

{
  ParserValidationErrorTest_Proto2CustomJsonConflictError_Test *this_local;
  
  ParserTest::ParserTest(&this->super_ParserValidationErrorTest);
  (this->super_ParserValidationErrorTest).super_Test._vptr_Test =
       (_func_int **)&PTR__ParserValidationErrorTest_Proto2CustomJsonConflictError_Test_02a0f688;
  return;
}

Assistant:

TEST_F(ParserValidationErrorTest, Proto2CustomJsonConflictError) {
  ExpectHasValidationErrors(
      "syntax = 'proto2';\n"
      "message TestMessage {\n"
      "  optional uint32 foo = 1 [json_name='baz'];\n"
      "  optional uint32 bar = 2 [json_name='baz'];\n"
      "}\n",
      "3:18: The custom JSON name of field \"bar\" (\"baz\") conflicts "
      "with the custom JSON name of field \"foo\".\n");
}